

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void anon_unknown.dwarf_12b4667::TranslateMemoryDecoration
               (TQualifier *qualifier,
               vector<spv::Decoration,_std::allocator<spv::Decoration>_> *memory,
               bool useVulkanMemoryModel)

{
  iterator iVar1;
  undefined8 in_RAX;
  undefined7 in_register_00000011;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if ((int)CONCAT71(in_register_00000011,useVulkanMemoryModel) == 0) {
    if ((*(ulong *)&qualifier->field_0x8 >> 0x32 & 1) == 0) {
      if ((*(ulong *)&qualifier->field_0x8 >> 0x31 & 1) == 0) goto LAB_0044253d;
    }
    else {
      uStack_18._0_4_ = (undefined4)in_RAX;
      uStack_18 = CONCAT44(0x15,(undefined4)uStack_18);
      iVar1._M_current =
           (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::
        _M_realloc_insert<spv::Decoration>(memory,iVar1,(Decoration *)((long)&uStack_18 + 4));
      }
      else {
        *iVar1._M_current = DecorationVolatile;
        (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
    uStack_18 = CONCAT44(0x17,(undefined4)uStack_18);
    iVar1._M_current =
         (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::
      _M_realloc_insert<spv::Decoration>(memory,iVar1,(Decoration *)((long)&uStack_18 + 4));
    }
    else {
      *iVar1._M_current = Coherent;
      (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
LAB_0044253d:
  if ((qualifier->field_0xd & 0x40) != 0) {
    uStack_18 = CONCAT44(0x13,(undefined4)uStack_18);
    iVar1._M_current =
         (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::
      _M_realloc_insert<spv::Decoration>(memory,iVar1,(Decoration *)((long)&uStack_18 + 4));
    }
    else {
      *iVar1._M_current = DecorationRestrict;
      (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  if ((qualifier->field_0xd & 0x80) != 0) {
    uStack_18 = CONCAT44(0x18,(undefined4)uStack_18);
    iVar1._M_current =
         (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::
      _M_realloc_insert<spv::Decoration>(memory,iVar1,(Decoration *)((long)&uStack_18 + 4));
    }
    else {
      *iVar1._M_current = DecorationNonWritable;
      (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  if ((qualifier->field_0xe & 1) != 0) {
    uStack_18 = CONCAT44(0x19,(undefined4)uStack_18);
    iVar1._M_current =
         (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::
      _M_realloc_insert<spv::Decoration>(memory,iVar1,(Decoration *)((long)&uStack_18 + 4));
    }
    else {
      *iVar1._M_current = DecorationNonReadable;
      (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  return;
}

Assistant:

void TranslateMemoryDecoration(const glslang::TQualifier& qualifier, std::vector<spv::Decoration>& memory,
    bool useVulkanMemoryModel)
{
    if (!useVulkanMemoryModel) {
        if (qualifier.isVolatile()) {
            memory.push_back(spv::DecorationVolatile);
            memory.push_back(spv::DecorationCoherent);
        } else if (qualifier.isCoherent()) {
            memory.push_back(spv::DecorationCoherent);
        }
    }
    if (qualifier.isRestrict())
        memory.push_back(spv::DecorationRestrict);
    if (qualifier.isReadOnly())
        memory.push_back(spv::DecorationNonWritable);
    if (qualifier.isWriteOnly())
       memory.push_back(spv::DecorationNonReadable);
}